

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_f13469::HandleCacheMode
               (cmExecutionStatus *status,string *name,OutType infoType,string *variable,
               string *propertyName)

{
  OutType infoType_00;
  string *this;
  bool bVar1;
  ulong uVar2;
  cmMakefile *pcVar3;
  cmState *pcVar4;
  cmValue local_80;
  cmValue local_78;
  cmValue value;
  allocator<char> local_59;
  string local_58;
  string *local_38;
  string *propertyName_local;
  string *variable_local;
  string *psStack_20;
  OutType infoType_local;
  string *name_local;
  cmExecutionStatus *status_local;
  
  local_38 = propertyName;
  propertyName_local = variable;
  variable_local._4_4_ = infoType;
  psStack_20 = name;
  name_local = (string *)status;
  uVar2 = std::__cxx11::string::empty();
  this = name_local;
  if ((uVar2 & 1) == 0) {
    cmValue::cmValue(&local_78,(nullptr_t)0x0);
    pcVar3 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)name_local);
    pcVar4 = cmMakefile::GetState(pcVar3);
    local_80 = cmState::GetCacheEntryValue(pcVar4,psStack_20);
    bVar1 = cmValue::operator_cast_to_bool(&local_80);
    if (bVar1) {
      pcVar3 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)name_local);
      pcVar4 = cmMakefile::GetState(pcVar3);
      local_78 = cmState::GetCacheEntryProperty(pcVar4,psStack_20,local_38);
    }
    infoType_00 = variable_local._4_4_;
    pcVar3 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)name_local);
    StoreResult<cmValue>(infoType_00,pcVar3,propertyName_local,local_78);
    status_local._7_1_ = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"not given name for CACHE scope.",&local_59);
    cmExecutionStatus::SetError((cmExecutionStatus *)this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    status_local._7_1_ = false;
  }
  return status_local._7_1_;
}

Assistant:

bool HandleCacheMode(cmExecutionStatus& status, const std::string& name,
                     OutType infoType, const std::string& variable,
                     const std::string& propertyName)
{
  if (name.empty()) {
    status.SetError("not given name for CACHE scope.");
    return false;
  }

  cmValue value = nullptr;
  if (status.GetMakefile().GetState()->GetCacheEntryValue(name)) {
    value = status.GetMakefile().GetState()->GetCacheEntryProperty(
      name, propertyName);
  }
  StoreResult(infoType, status.GetMakefile(), variable, value);
  return true;
}